

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::addThread(ThreadedSocketInitiator *this,socket_handle s,thread_id t)

{
  Locker LVar1;
  mapped_type_conflict2 *pmVar2;
  Locker local_28;
  Locker l;
  thread_id t_local;
  ThreadedSocketInitiator *pTStack_10;
  socket_handle s_local;
  ThreadedSocketInitiator *this_local;
  
  l.m_mutex = (Mutex *)t;
  t_local._4_4_ = s;
  pTStack_10 = this;
  Locker::Locker(&local_28,&this->m_mutex);
  LVar1.m_mutex = l.m_mutex;
  pmVar2 = std::
           map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           ::operator[](&this->m_threads,(key_type *)((long)&t_local + 4));
  *pmVar2 = (mapped_type_conflict2)LVar1.m_mutex;
  Locker::~Locker(&local_28);
  return;
}

Assistant:

void ThreadedSocketInitiator::addThread(socket_handle s, thread_id t) {
  Locker l(m_mutex);

  m_threads[s] = t;
}